

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O0

bool __thiscall
CorUnix::CSimpleHandleManager::ValidateHandle(CSimpleHandleManager *this,HANDLE handle)

{
  bool bVar1;
  HANDLE_INDEX HVar2;
  DWORD dwIndex;
  HANDLE handle_local;
  CSimpleHandleManager *this_local;
  
  if (this->m_rghteHandleTable == (HANDLE_TABLE_ENTRY *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ValidateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
            ,0x116);
    fprintf(_stderr,"Handle Manager is not initialized!\n");
    this_local._7_1_ = false;
  }
  else if (((undefined1 *)handle == &DAT_ffffffffffffffff) || (handle == (HANDLE)0x0)) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = HandleIsSpecial(handle);
    if (bVar1) {
      fprintf(_stderr,"] %s %s:%d","ValidateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
              ,0x12a);
      fprintf(_stderr,"Handle %p is a special handle, returning FALSE.\n",handle);
      this_local._7_1_ = false;
    }
    else {
      HVar2 = HandleToHandleIndex(this,handle);
      if ((uint)HVar2 < this->m_dwTableSize) {
        if ((this->m_rghteHandleTable[HVar2 & 0xffffffff].fEntryAllocated & 1U) == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CSimpleHandleManager::ValidateHandle(HANDLE handle)
{
    DWORD dwIndex;
    
    if (NULL == m_rghteHandleTable)
    {
        ASSERT("Handle Manager is not initialized!\n");
        return FALSE;
    }
    
    if (handle == INVALID_HANDLE_VALUE || handle == 0)
    {
        TRACE( "INVALID_HANDLE_VALUE or NULL value is not a valid handle.\n" );
        return FALSE;
    }

    if (HandleIsSpecial(handle))
    {
        //
        // Special handles are valid in the general sense. They are not valid
        // in this context, though, as they were not allocated by the handle
        // manager. Hitting this case indicates a logic error within the PAL
        // (since clients of the handle manager should have already dealt with
        // the specialness of the handle) so we assert here.
        //
        
        ASSERT ("Handle %p is a special handle, returning FALSE.\n", handle);
        return FALSE;
    }

    dwIndex = HandleToHandleIndex(handle);

    if (dwIndex >= m_dwTableSize)
    {
        WARN( "The handle value(%p) is out of the bounds for the handle table.\n", handle );
        return FALSE;
    }

    if (!m_rghteHandleTable[dwIndex].fEntryAllocated)
    {
        WARN("The handle value (%p) has not been allocated\n", handle);
        return FALSE;
    }

    return TRUE;
}